

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

ssize_t __thiscall
TadsServerThread::send(TadsServerThread *this,int __fd,void *__buf,size_t __n,int __flags)

{
  OS_Event *pOVar1;
  int iVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  unsigned_long in_stack_00000040;
  OS_Waitable **in_stack_00000048;
  OS_Waitable *w [3];
  int ok;
  size_t cur;
  OS_Waitable *local_80;
  OS_Waitable **in_stack_ffffffffffffff88;
  OS_Event *in_stack_ffffffffffffff90;
  OS_Waitable *local_68;
  OS_Waitable *local_40;
  OS_Waitable *local_38;
  int local_2c;
  OS_Waitable *local_28;
  void *local_20;
  long local_18;
  TadsServerThread *local_10;
  uint local_4;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  local_80 = (OS_Waitable *)__n;
  local_20 = __buf;
  local_10 = this;
  do {
    while( true ) {
      if (local_20 == (void *)0x0) {
        set_run_state((TadsServerThread *)in_stack_ffffffffffffff90,
                      (char *)in_stack_ffffffffffffff88);
        local_4 = 1;
        goto LAB_0025f438;
      }
      set_run_state((TadsServerThread *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88)
      ;
      sVar3 = OS_Socket::send(this->socket,(int)local_18,local_20,(size_t)local_80,__flags);
      local_28 = (OS_Waitable *)(long)(int)sVar3;
      if (local_28 == (OS_Waitable *)0xffffffffffffffff) break;
      local_18 = (long)&local_28->_vptr_OS_Waitable + local_18;
      local_20 = (void *)((long)local_20 - (long)local_28);
      local_80 = local_28;
    }
    local_2c = 0;
    iVar2 = OS_CoreSocket::last_error(&this->socket->super_OS_CoreSocket);
    if (iVar2 == 0xb) {
      set_run_state((TadsServerThread *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88)
      ;
      in_stack_ffffffffffffff88 = &local_40;
      in_stack_ffffffffffffff90 = this->listener->quit_evt;
      local_68 = (OS_Waitable *)0x0;
      if (in_stack_ffffffffffffff90 != (OS_Event *)0x0) {
        local_68 = &in_stack_ffffffffffffff90->super_OS_Waitable;
      }
      local_40 = local_68;
      pOVar1 = this->listener->shutdown_evt;
      local_80 = (OS_Waitable *)0x0;
      if (pOVar1 != (OS_Event *)0x0) {
        local_80 = &pOVar1->super_OS_Waitable;
      }
      local_38 = local_80;
      iVar2 = OS_Waitable::multi_wait(w[0]._4_4_,in_stack_00000048,in_stack_00000040);
      if (iVar2 == 0) {
        OS_CoreSocket::reset_event(&this->socket->super_OS_CoreSocket);
        local_2c = 1;
      }
    }
  } while (local_2c != 0);
  local_4 = 0;
LAB_0025f438:
  return (ulong)local_4;
}

Assistant:

int TadsServerThread::send(const char *buf, size_t len)
{
    /* keep going until we satisfy the write request or run into trouble */
    while (len != 0)
    {
        /* try sending */
        set_run_state("Sending");
        size_t cur = socket->send(buf, len);

        /* check what happened */
        if (cur == OS_SOCKET_ERROR)
        {
            /* error reading socket - presume failure */
            int ok = FALSE;

            /* if this is a 'would block' error, wait for the socket */
            if (socket->last_error() == OS_EWOULDBLOCK)
            {
                /* wait for the socket to unblock, or for the Quit event */
                set_run_state("Waiting(send)");
                OS_Waitable *w[] = {
                    socket, listener->quit_evt, listener->shutdown_evt
                };
                if (OS_Waitable::multi_wait(3, w) == OSWAIT_EVENT + 0)
                {
                    /* socket is ready - reset it and carry on */
                    socket->reset_event();
                    ok = TRUE;
                }
            }

            /* if we didn't solve the problem, fail */
            if (!ok)
                return FALSE;
        }
        else
        {
            /* adjust the counters for the write */
            buf += cur;
            len -= cur;
        }
    }

    /* we successfully sent all of the requested data */
    set_run_state("Send completed");
    return TRUE;
}